

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Node * __thiscall Graph::getNode(Graph *this,int idx)

{
  bool bVar1;
  reference ppNVar2;
  ostream *poVar3;
  Node **node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  int idx_local;
  Graph *this_local;
  
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->adj_list);
  node = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->adj_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Node ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,idx);
      std::operator<<(poVar3,"does not exist\n");
      return (Node *)0x0;
    }
    ppNVar2 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    if ((*ppNVar2)->index == idx) break;
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return *ppNVar2;
}

Assistant:

Node* Graph::getNode(int idx) {
    // TODO: Look for a way to sort by index to compute faster this operation
    for(auto&node:adj_list)
        if(node->index == idx)
            return node;
    std::cerr<<"Node "<< idx << "does not exist\n";
    return nullptr;
}